

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::RefcountedClient::~RefcountedClient
          (RefcountedClient *this)

{
  NullableValue<kj::Exception> *other;
  Exception *pEVar1;
  uint uVar2;
  bool local_361;
  bool _kj_shouldLog;
  Exception *exception;
  undefined1 local_348 [416];
  undefined1 local_1a8 [8];
  NullableValue<kj::Exception> _exception6045;
  RefcountedClient *this_local;
  
  uVar2 = this->parent->activeConnectionCount - 1;
  this->parent->activeConnectionCount = uVar2;
  local_348._0_8_ = this;
  _exception6045.field_1.value.details.builder.disposer = (ArrayDisposer *)this;
  runCatchingExceptions<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient::~RefcountedClient()::_lambda()_1_>
            ((Maybe<kj::Exception> *)(local_348 + 8),(kj *)local_348,
             (anon_class_8_1_8991fb9c *)(ulong)uVar2);
  other = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)(local_348 + 8));
  kj::_::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)local_1a8,other);
  Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)(local_348 + 8));
  pEVar1 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_1a8);
  if (pEVar1 != (Exception *)0x0) {
    pEVar1 = kj::_::NullableValue<kj::Exception>::operator*
                       ((NullableValue<kj::Exception> *)local_1a8);
    local_361 = kj::_::Debug::shouldLog(ERROR);
    while (local_361 != false) {
      kj::_::Debug::log<kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x179e,ERROR,"exception",pEVar1);
      local_361 = false;
    }
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_1a8);
  Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::~Own(&this->client);
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~RefcountedClient() noexcept(false) {
      --parent.activeConnectionCount;
      KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
        parent.returnClientToAvailable(kj::mv(client));
      })) {
        KJ_LOG(ERROR, exception);
      }
    }